

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O3

int __thiscall Fl_Menu_::find_index(Fl_Menu_ *this,char *pathname)

{
  Fl_Menu_Item *pFVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  int t;
  long lVar6;
  char menupath [1024];
  char itempath [1024];
  char local_838 [1024];
  char local_438 [1032];
  
  lVar5 = 0;
  memset(local_838,0,0x400);
  lVar6 = 0;
  while( true ) {
    if (this->menu_ == (Fl_Menu_Item *)0x0) {
      lVar3 = 0;
    }
    else {
      iVar2 = Fl_Menu_Item::size(this->menu_);
      lVar3 = (long)iVar2;
    }
    if (lVar3 <= lVar6) break;
    pFVar1 = this->menu_;
    if ((*(byte *)((long)&pFVar1->flags + lVar5) & 0x40) == 0) {
      if (*(long *)((long)&pFVar1->text + lVar5) != 0) {
        strcpy(local_438,local_838);
        if (local_438[0] != '\0') {
          fl_strlcat(local_438,"/",0x400);
        }
        fl_strlcat(local_438,*(char **)((long)&pFVar1->text + lVar5),0x400);
        pcVar4 = local_438;
        goto LAB_001bfeb9;
      }
      pcVar4 = strrchr(local_838,0x2f);
      if (pcVar4 == (char *)0x0) {
        local_838[0] = '\0';
      }
      else {
        *pcVar4 = '\0';
      }
    }
    else {
      if (local_838[0] != '\0') {
        fl_strlcat(local_838,"/",0x400);
      }
      fl_strlcat(local_838,*(char **)((long)&pFVar1->text + lVar5),0x400);
      pcVar4 = local_838;
LAB_001bfeb9:
      iVar2 = strcmp(pcVar4,pathname);
      if (iVar2 == 0) goto LAB_001bfef7;
    }
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x38;
  }
  lVar6 = 0xffffffff;
LAB_001bfef7:
  return (int)lVar6;
}

Assistant:

int Fl_Menu_::find_index(const char *pathname) const {
  char menupath[1024] = "";	// File/Export
  for ( int t=0; t < size(); t++ ) {
    Fl_Menu_Item *m = menu_ + t;
    if (m->flags&FL_SUBMENU) {
      // IT'S A SUBMENU
      // we do not support searches through FL_SUBMENU_POINTER links
      if (menupath[0]) strlcat(menupath, "/", sizeof(menupath));
      strlcat(menupath, m->label(), sizeof(menupath));
      if (!strcmp(menupath, pathname)) return(t);
    } else {
      if (!m->label()) {
	// END OF SUBMENU? Pop back one level.
	char *ss = strrchr(menupath, '/');
	if ( ss ) *ss = 0;
	else menupath[0] = '\0';
	continue;
      }
      // IT'S A MENU ITEM
      char itempath[1024];	// eg. Edit/Copy
      strcpy(itempath, menupath);
      if (itempath[0]) strlcat(itempath, "/", sizeof(itempath));
      strlcat(itempath, m->label(), sizeof(itempath));
      if (!strcmp(itempath, pathname)) return(t);
    }
  }
  return(-1);
}